

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>
               (date_t input,timestamp_t *result,bool strict)

{
  bool bVar1;
  int64_t iVar2;
  dtime_t time;
  
  if (input.days == -0x7fffffff) {
    iVar2 = -0x7fffffffffffffff;
  }
  else {
    if (input.days != 0x7fffffff) {
      time = Time::FromTime(0,0,0,0);
      bVar1 = Timestamp::TryFromDatetime(input,time,result);
      return bVar1;
    }
    iVar2 = 0x7fffffffffffffff;
  }
  result->value = iVar2;
  return true;
}

Assistant:

bool TryCast::Operation(date_t input, timestamp_t &result, bool strict) {
	if (input == date_t::infinity()) {
		result = timestamp_t::infinity();
		return true;
	} else if (input == date_t::ninfinity()) {
		result = timestamp_t::ninfinity();
		return true;
	}
	return Timestamp::TryFromDatetime(input, Time::FromTime(0, 0, 0), result);
}